

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::BlockEnd(w3Interp *this)

{
  pointer pwVar1;
  undefined8 *extraout_RAX;
  undefined8 *puVar2;
  undefined8 extraout_RAX_00;
  long lVar3;
  ulong uVar4;
  char extraout_DL;
  char cVar5;
  ulong uVar6;
  w3Stack *this_00;
  string local_28;
  
  pwVar1 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pwVar1;
  if (lVar3 != 0) {
    this_00 = &this->super_w3Stack;
    lVar3 = lVar3 >> 4;
    uVar6 = lVar3 * -0x5555555555555555;
    puVar2 = (undefined8 *)((long)&pwVar1->tag + lVar3 * 0x10);
    uVar4 = 0;
    do {
      cVar5 = *(char *)(puVar2 + -6);
      if (cVar5 != -0x80) goto LAB_00119b54;
      puVar2 = puVar2 + -6;
      uVar4 = uVar4 + 1;
    } while (uVar6 - uVar4 != 0);
    do {
      BlockEnd();
      puVar2 = extraout_RAX;
      cVar5 = extraout_DL;
LAB_00119b54:
    } while (1 < (byte)(cVar5 + 0x7fU));
    if (~uVar4 + uVar6 < uVar6) {
      lVar3 = uVar4 + 1;
      do {
        puVar2[-2] = puVar2[4];
        puVar2[-1] = puVar2[5];
        puVar2[-4] = puVar2[2];
        puVar2[-3] = puVar2[3];
        puVar2[-6] = *puVar2;
        puVar2[-5] = puVar2[1];
        puVar2 = puVar2 + 6;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    std::vector<w3StackValue,_std::allocator<w3StackValue>_>::resize
              ((vector<w3StackValue,_std::allocator<w3StackValue>_> *)this_00,uVar6 - 1);
    return;
  }
  StringFormat_abi_cxx11_(&local_28,"%lX",0);
  AssertFailedFormat("s > 0",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

INTERP (Rem_s_i64)
{
    const int64_t a = pop_i64 ();
    i64 () %= a;
}